

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subcircuit.cpp
# Opt level: O2

bool __thiscall SubCircuit<0>::propagateSCC(SubCircuit<0> *this,int root)

{
  vec<int> *other;
  vec<int> *other_00;
  int *piVar1;
  IntVar *pIVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  Clause *pCVar6;
  Lit *pLVar7;
  int i;
  long lVar8;
  uint uVar9;
  uint i_2;
  int reasonIndex;
  ulong uVar10;
  vec<int> *this_00;
  uint i_19;
  vec<int> *pvVar11;
  uint i_17;
  vec<int> local_298;
  int local_27c;
  vec<int> local_278;
  vec<int> local_268;
  undefined8 local_250;
  int local_248;
  int root_local;
  Clause *local_240;
  int backto;
  int backfrom;
  ulong local_230;
  ulong local_228;
  int numback;
  vec<int> local_218;
  vec<int> local_208;
  iterator i_1;
  vec<int> local_1d0;
  vec<int> local_1c0;
  vec<int> local_1b0;
  vec<int> local_1a0 [7];
  vec<int> local_130;
  vec<int> local_120;
  vec<int> local_110;
  vec<int> local_100;
  vec<int> local_f0;
  vec<int> local_e0;
  vec<int> local_d0;
  vec<int> local_c0;
  vec<int> local_b0;
  vec<int> local_a0;
  vec<int> local_90;
  ulong local_80;
  vec<int> *local_78;
  vec<int> local_70;
  vec<int> local_60;
  vec<int> local_50;
  vec<int> local_40;
  
  backfrom = 0;
  backto = 0;
  numback = 0;
  local_298.sz = 0;
  local_298.cap = 0;
  local_298.data = (int *)0x0;
  root_local = root;
  vec<int>::reserve(&local_298,*(uint *)&(this->super_Propagator).field_0x14);
  other = &this->prev;
  if ((this->prev).data != (int *)0x0) {
    other->sz = 0;
  }
  other_00 = &this->earlier;
  if ((this->earlier).data != (int *)0x0) {
    other_00->sz = 0;
  }
  pvVar11 = &this->later;
  if ((this->later).data != (int *)0x0) {
    pvVar11->sz = 0;
  }
  piVar1 = this->index;
  for (lVar8 = 0; lVar8 < *(int *)&(this->super_Propagator).field_0x14; lVar8 = lVar8 + 1) {
    piVar1[lVar8] = -1;
  }
  piVar1[root_local] = 0;
  this->lowlink[root_local] = 0;
  this->nodesSeen = 1;
  if ((this->propQueue).data != (PROP *)0x0) {
    (this->propQueue).sz = 0;
  }
  i_1.view = this->x + root_local;
  i_1.forward.var = this->x[root_local].var;
  i_1.forward.val = ((i_1.forward.var)->min).v;
  local_228 = 0;
  local_250 = (Clause *)((ulong)local_250._4_4_ << 0x20);
  local_78 = pvVar11;
  do {
    if (this->index[i_1.forward.val] == -1) {
      numback = 0;
      bVar3 = exploreSubtree(this,i_1.forward.val,(int)local_250,(int)local_228,&backfrom,&backto,
                             &numback);
      if (!bVar3) {
LAB_001367eb:
        free(local_298.data);
        return false;
      }
      if (local_298.data != (int *)0x0) {
        local_298._0_8_ = local_298._0_8_ & 0xffffffff00000000;
      }
      if ((this->later).data != (int *)0x0) {
        pvVar11->sz = 0;
      }
      uVar4 = 0;
      while( true ) {
        local_268.sz = uVar4;
        if (*(int *)&(this->super_Propagator).field_0x14 <= (int)uVar4) break;
        this_00 = pvVar11;
        if ((this->index[(int)uVar4] < 0) ||
           (this_00 = &local_298, (int)local_228 < this->index[(int)uVar4])) {
          vec<int>::push(this_00,(int *)&local_268);
        }
        uVar4 = local_268.sz + 1;
      }
      vec<int>::vec<int>(&local_90,&local_298);
      local_248 = (int)getEvidenceLit(this,&local_90);
      free(local_90.data);
      local_90.data = (int *)0x0;
      vec<int>::vec<int>(&local_a0,other);
      local_27c = (int)getEvidenceLit(this,&local_a0);
      free(local_a0.data);
      pvVar11 = local_78;
      local_a0.data = (int *)0x0;
      local_268.sz = 0;
      local_268.cap = 0;
      local_268.data = (int *)0x0;
      if (other->sz == 0) {
        lVar8 = 0;
        for (uVar10 = 0; uVar10 < pvVar11->sz; uVar10 = uVar10 + 1) {
          vec<int>::push(&local_268,(int *)((long)(this->later).data + lVar8));
          lVar8 = lVar8 + 4;
        }
        vec<int>::push(&local_268,&root_local);
        vec<int>::vec<int>(&local_b0,&local_268);
        local_27c = (int)getEvidenceLit(this,&local_b0);
        free(local_b0.data);
        local_b0.data = (int *)0x0;
      }
      if (local_27c == 1 || local_248 == 1) {
LAB_00136302:
        lVar8 = 0;
        for (uVar10 = 0; piVar1 = (this->prev).data, uVar10 < (this->prev).sz; uVar10 = uVar10 + 1)
        {
          vec<int>::push(other_00,(int *)((long)piVar1 + lVar8));
          lVar8 = lVar8 + 4;
        }
        if (piVar1 != (int *)0x0) {
          other->sz = 0;
        }
        lVar8 = 0;
        for (uVar10 = 0; uVar10 < (local_298._0_8_ & 0xffffffff); uVar10 = uVar10 + 1) {
          vec<int>::push(other,(int *)((long)local_298.data + lVar8));
          lVar8 = lVar8 + 4;
        }
        local_250 = (Clause *)CONCAT44(local_250._4_4_,(int)local_228 + 1);
        local_228 = (ulong)(this->nodesSeen - 1);
        bVar3 = true;
      }
      else {
        if (numback != 0) {
          if ((numback == 1) && (this->fixReq != false)) {
            if (so.lazy == true) {
              uVar4 = other->sz;
              if (uVar4 == 0) {
                local_250 = Reason_new(local_268.sz * local_298.sz + 2);
                pLVar7 = Clause::operator[](local_250,1);
                pLVar7->x = local_248;
                pLVar7 = Clause::operator[](local_250,2);
                pLVar7->x = local_27c;
                vec<int>::vec<int>(&local_1d0,&local_298);
                pCVar6 = local_250;
                vec<int>::vec<int>(&local_110,&local_268);
                explainAcantreachB(this,pCVar6,3,&local_1d0,&local_110,backfrom,backto);
                free(local_110.data);
                local_110.data = (int *)0x0;
                free(local_1d0.data);
                local_1d0.data = (int *)0x0;
              }
              else {
                local_278.sz = 0;
                local_278.cap = 0;
                local_278.data = (int *)0x0;
                lVar8 = 0;
                for (uVar10 = 0; uVar10 < uVar4; uVar10 = uVar10 + 1) {
                  vec<int>::push(&local_278,(int *)((long)(this->prev).data + lVar8));
                  uVar4 = (this->prev).sz;
                  lVar8 = lVar8 + 4;
                }
                lVar8 = 0;
                for (uVar10 = 0; uVar10 < pvVar11->sz; uVar10 = uVar10 + 1) {
                  vec<int>::push(&local_278,(int *)((long)(this->later).data + lVar8));
                  lVar8 = lVar8 + 4;
                }
                local_208.sz = 0;
                local_208.cap = 0;
                local_208.data = (int *)0x0;
                lVar8 = 0;
                for (uVar10 = 0; uVar10 < (local_278._0_8_ & 0xffffffff); uVar10 = uVar10 + 1) {
                  vec<int>::push(&local_208,(int *)((long)local_278.data + lVar8));
                  lVar8 = lVar8 + 4;
                }
                lVar8 = 0;
                for (uVar10 = 0; uVar5 = local_298._0_8_ & 0xffffffff, uVar10 < uVar5;
                    uVar10 = uVar10 + 1) {
                  vec<int>::push(&local_208,(int *)((long)local_298.data + lVar8));
                  lVar8 = lVar8 + 4;
                }
                local_218.sz = 0;
                local_218.cap = 0;
                local_218.data = (int *)0x0;
                lVar8 = 0;
                for (uVar10 = 0; uVar10 < uVar5; uVar10 = uVar10 + 1) {
                  vec<int>::push(&local_218,(int *)((long)local_298.data + lVar8));
                  uVar5 = local_298._0_8_ & 0xffffffff;
                  lVar8 = lVar8 + 4;
                }
                lVar8 = 0;
                for (uVar10 = 0; uVar10 < pvVar11->sz; uVar10 = uVar10 + 1) {
                  vec<int>::push(&local_218,(int *)((long)(this->later).data + lVar8));
                  lVar8 = lVar8 + 4;
                }
                uVar9 = local_208.sz * (this->earlier).sz;
                local_240 = (Clause *)(ulong)uVar9;
                uVar4 = local_218.sz * (this->prev).sz;
                local_230 = (ulong)uVar4;
                pCVar6 = Reason_new(local_278.sz * local_298.sz + uVar4 + uVar9 + 2);
                local_250 = pCVar6;
                pLVar7 = Clause::operator[](pCVar6,1);
                pLVar7->x = local_248;
                pLVar7 = Clause::operator[](pCVar6,2);
                pLVar7->x = local_27c;
                vec<int>::vec<int>(&local_40,other_00);
                vec<int>::vec<int>(&local_50,&local_208);
                explainAcantreachB(this,local_250,3,&local_40,&local_50,-1,-1);
                free(local_50.data);
                local_50.data = (int *)0x0;
                free(local_40.data);
                local_40.data = (int *)0x0;
                uVar4 = (int)local_240 + 3;
                vec<int>::vec<int>(&local_120,other);
                vec<int>::vec<int>(&local_60,&local_218);
                local_240 = (Clause *)(ulong)uVar4;
                explainAcantreachB(this,local_250,uVar4,&local_120,&local_60,-1,-1);
                free(local_60.data);
                local_60.data = (int *)0x0;
                free(local_120.data);
                local_120.data = (int *)0x0;
                local_230 = (ulong)(uint)((int)local_230 + (int)local_240);
                vec<int>::vec<int>(&local_130,&local_298);
                vec<int>::vec<int>(&local_70,&local_278);
                pCVar6 = local_250;
                explainAcantreachB(this,local_250,(int)local_230,&local_130,&local_70,backfrom,
                                   backto);
                free(local_70.data);
                local_70.data = (int *)0x0;
                free(local_130.data);
                local_130.data = (int *)0x0;
                free(local_218.data);
                free(local_208.data);
                free(local_278.data);
              }
            }
            else {
              pCVar6 = (Clause *)0x0;
            }
            addPropagation(this,true,backfrom,backto,pCVar6);
          }
          goto LAB_00136302;
        }
        if (so.lazy == true) {
          uVar4 = other->sz;
          if (uVar4 == 0) {
            pCVar6 = Reason_new(local_268.sz * local_298.sz + 2);
            local_240 = pCVar6;
            pLVar7 = Clause::operator[](pCVar6,1);
            pLVar7->x = local_248;
            pLVar7 = Clause::operator[](pCVar6,2);
            pLVar7->x = local_27c;
            vec<int>::vec<int>(local_1a0,&local_298);
            vec<int>::vec<int>(&local_c0,&local_268);
            pCVar6 = local_240;
            explainAcantreachB(this,local_240,3,local_1a0,&local_c0,*local_298.data,*local_268.data)
            ;
            free(local_c0.data);
            local_c0.data = (int *)0x0;
            free(local_1a0[0].data);
            local_1a0[0].data = (int *)0x0;
            pIVar2 = this->x[*local_298.data].var;
            (*(pIVar2->super_Var).super_Branching._vptr_Branching[0x10])
                      (pIVar2,(long)*local_268.data,pCVar6,1);
          }
          else {
            local_278.sz = 0;
            local_278.cap = 0;
            local_278.data = (int *)0x0;
            lVar8 = 0;
            for (uVar10 = 0; uVar10 < uVar4; uVar10 = uVar10 + 1) {
              vec<int>::push(&local_278,(int *)((long)(this->prev).data + lVar8));
              uVar4 = (this->prev).sz;
              lVar8 = lVar8 + 4;
            }
            lVar8 = 0;
            for (uVar10 = 0; uVar10 < pvVar11->sz; uVar10 = uVar10 + 1) {
              vec<int>::push(&local_278,(int *)((long)(this->later).data + lVar8));
              lVar8 = lVar8 + 4;
            }
            local_208.sz = 0;
            local_208.cap = 0;
            local_208.data = (int *)0x0;
            lVar8 = 0;
            for (uVar10 = 0; uVar10 < (local_278._0_8_ & 0xffffffff); uVar10 = uVar10 + 1) {
              vec<int>::push(&local_208,(int *)((long)local_278.data + lVar8));
              lVar8 = lVar8 + 4;
            }
            lVar8 = 0;
            for (uVar10 = 0; uVar5 = local_298._0_8_ & 0xffffffff, uVar10 < uVar5;
                uVar10 = uVar10 + 1) {
              vec<int>::push(&local_208,(int *)((long)local_298.data + lVar8));
              lVar8 = lVar8 + 4;
            }
            local_218.sz = 0;
            local_218.cap = 0;
            local_218.data = (int *)0x0;
            lVar8 = 0;
            for (uVar10 = 0; uVar10 < uVar5; uVar10 = uVar10 + 1) {
              vec<int>::push(&local_218,(int *)((long)local_298.data + lVar8));
              uVar5 = local_298._0_8_ & 0xffffffff;
              lVar8 = lVar8 + 4;
            }
            lVar8 = 0;
            for (uVar10 = 0; uVar10 < pvVar11->sz; uVar10 = uVar10 + 1) {
              vec<int>::push(&local_218,(int *)((long)(this->later).data + lVar8));
              lVar8 = lVar8 + 4;
            }
            uVar9 = local_208.sz * (this->earlier).sz;
            local_80 = (ulong)uVar9;
            uVar4 = local_218.sz * (this->prev).sz;
            local_230 = (ulong)uVar4;
            pCVar6 = Reason_new(local_278.sz * local_298.sz + uVar4 + uVar9 + 2);
            local_240 = pCVar6;
            pLVar7 = Clause::operator[](pCVar6,1);
            pLVar7->x = local_248;
            pLVar7 = Clause::operator[](pCVar6,2);
            pLVar7->x = local_27c;
            vec<int>::vec<int>(&local_d0,other_00);
            vec<int>::vec<int>(&local_e0,&local_208);
            explainAcantreachB(this,local_240,3,&local_d0,&local_e0,-1,-1);
            free(local_e0.data);
            local_e0.data = (int *)0x0;
            free(local_d0.data);
            local_d0.data = (int *)0x0;
            reasonIndex = (int)local_80 + 3;
            vec<int>::vec<int>(&local_1b0,other);
            vec<int>::vec<int>(&local_1c0,&local_218);
            explainAcantreachB(this,local_240,reasonIndex,&local_1b0,&local_1c0,-1,-1);
            free(local_1c0.data);
            local_1c0.data = (int *)0x0;
            free(local_1b0.data);
            local_1b0.data = (int *)0x0;
            local_230 = (ulong)(uint)((int)local_230 + reasonIndex);
            vec<int>::vec<int>(&local_f0,&local_298);
            vec<int>::vec<int>(&local_100,&local_278);
            explainAcantreachB(this,local_240,(int)local_230,&local_f0,&local_100,*local_298.data,
                               *local_278.data);
            free(local_100.data);
            local_100.data = (int *)0x0;
            free(local_f0.data);
            local_f0.data = (int *)0x0;
            pIVar2 = this->x[*local_298.data].var;
            (*(pIVar2->super_Var).super_Branching._vptr_Branching[0x10])
                      (pIVar2,(long)*local_278.data,local_240,1);
            free(local_218.data);
            free(local_208.data);
            free(local_278.data);
          }
          bVar3 = false;
        }
        else {
          bVar3 = false;
        }
      }
      free(local_268.data);
      if (!bVar3) goto LAB_001367eb;
    }
    IntVar::iterator::operator++(&i_1.forward);
  } while( true );
}

Assistant:

bool propagateSCC(int root) {
		int backfrom = 0;  // the last back edge found
		int backto = 0;
		int numback = 0;  // the number of back edges found

		vec<int> thisSubtree;

		thisSubtree.reserve(size);
		prev.clear();
		earlier.clear();
		later.clear();

		assert(!x[root].isFixed() || x[root].getVal() != root);
		for (int i = 0; i < size; i++) {
			index[i] = -1;  // unvisited
		}

		index[root] = 0;  // first node visited
		lowlink[root] = 0;

		nodesSeen = 1;  // only seen root node
		propQueue.clear();

		// original subtree is just the root node
		int startSubtree = 0;
		int endSubtree = 0;

		// explore children of the root node
		for (typename IntView<U>::iterator i = x[root].begin(); i != x[root].end(); ++i) {
			const int child = *i;

			if (index[child] == -1)  // if haven't explored this yet
			{
				numback = 0;
				if (!exploreSubtree(child, startSubtree, endSubtree, &backfrom, &backto, &numback)) {
					// fprintf(stderr, "failed in subtree\n");
					return false;  // fail if we found a scc within the child
				}

				// Find the nodes in the subtree we just explored and the ones still to be explored
				thisSubtree.clear();
				later.clear();
				for (int i = 0; i < size; i++) {
					if (index[i] < 0) {
						later.push(i);
					} else if (index[i] > endSubtree) {
						thisSubtree.push(i);
					}
				}

				const Lit evidenceThis = getEvidenceLit(thisSubtree);
				Lit evidenceOther = getEvidenceLit(prev);
				vec<int> alloutside;
				if (prev.size() == 0) {
					for (unsigned int i = 0; i < later.size(); i++) {
						alloutside.push(later[i]);
					}
					alloutside.push(root);
					evidenceOther = getEvidenceLit(alloutside);
				}

				if (evidenceThis != lit_True && evidenceOther != lit_True) {
					// If there's no edge from the new subtree back to the
					// previous one and both of these groups has
					// a variable definitely in, fail
					if (numback == 0) {
						// XXX [AS] Commented following line, because propagator related statistics
						// should be collected within the propagator class.
						// engine.nobackedge++;
						if (so.lazy) {
							// If prev is empty then this is the first subtree,
							// and we just need to say that
							// the nodes in this subtree can't reach the
							// unexplored nodes or the root.
							// This is only a problem if something outside this subtree has to be in.
							if (prev.size() == 0) {
								Clause* r = Reason_new(thisSubtree.size() * alloutside.size() + 2);
								(*r)[1] = evidenceThis;
								(*r)[2] = evidenceOther;
								// This subtree can't reach outside
								explainAcantreachB(r, 3, thisSubtree, alloutside, thisSubtree[0], alloutside[0]);
								x[thisSubtree[0]].setVal(alloutside[0], r);

								return false;
							}

							// Assuming we have at least one previous subtree,
							// the reason we're failing is that
							// 1. nodes in earlier subtrees can't reach the
							// previous one this one or unexplored ones,
							// 2. nodes in the previous subtree can't reach
							// this one or unexplored ones,
							// 3. and nodes in this subtree can't reach the
							// previous one or unexplored ones.
							vec<int> prev_later;
							for (unsigned int i = 0; i < prev.size(); i++) {
								prev_later.push(prev[i]);
							}
							for (unsigned int i = 0; i < later.size(); i++) {
								prev_later.push(later[i]);
							}
							vec<int> prev_this_later;
							for (unsigned int i = 0; i < prev_later.size(); i++) {
								prev_this_later.push(prev_later[i]);
							}
							for (unsigned int i = 0; i < thisSubtree.size(); i++) {
								prev_this_later.push(thisSubtree[i]);
							}
							vec<int> this_later;
							for (unsigned int i = 0; i < thisSubtree.size(); i++) {
								this_later.push(thisSubtree[i]);
							}
							for (unsigned int i = 0; i < later.size(); i++) {
								this_later.push(later[i]);
							}

							const int size1 = earlier.size() * prev_this_later.size();
							const int size2 = prev.size() * this_later.size();
							const int size3 = thisSubtree.size() * prev_later.size();
							assert(prev_later.size() > 0);
							Clause* r = Reason_new(size1 + size2 + size3 + 2);
							(*r)[1] = evidenceThis;
							(*r)[2] = evidenceOther;
							// 1. Earlier can't reach prev, this or later
							explainAcantreachB(r, 3, earlier, prev_this_later);

							// 2. Prev can't reach this or later
							explainAcantreachB(r, 3 + size1, prev, this_later);

							// 3. this can't reach prev or later
							explainAcantreachB(r, 3 + size1 + size2, thisSubtree, prev_later, thisSubtree[0],
																 prev_later[0]);
							x[thisSubtree[0]].setVal(prev_later[0], r);
						}
						return false;
					}

					// If there's only one, the back edge is required (only propagate if the option is set)
					if (fixReq && numback == 1) {
						// XXX [AS] Commented following line, because propagator related statistics
						// should be collected within the propagator class.
						// engine.fixedBackedge++;
						Clause* r = nullptr;
						if (so.lazy) {
							// If this is the first subtree, the reason we're setting this link is that
							// there is no other link between nodes of this subtree to nodes outside the subtree
							// including the root
							if (prev.size() == 0) {
								r = Reason_new(thisSubtree.size() * alloutside.size() + 2);
								(*r)[1] = evidenceThis;
								(*r)[2] = evidenceOther;
								// This subtree can't reach outside (except backfrom to backto)
								explainAcantreachB(r, 3, thisSubtree, alloutside, backfrom, backto);
							} else {
								// Otherwise we have at least one previous subtree.
								// The reason is the same as when failing above,
								// but we leave out the one we're setting
								vec<int> prev_later;
								for (unsigned int i = 0; i < prev.size(); i++) {
									prev_later.push(prev[i]);
								}
								for (unsigned int i = 0; i < later.size(); i++) {
									prev_later.push(later[i]);
								}
								vec<int> prev_this_later;
								for (unsigned int i = 0; i < prev_later.size(); i++) {
									prev_this_later.push(prev_later[i]);
								}
								for (unsigned int i = 0; i < thisSubtree.size(); i++) {
									prev_this_later.push(thisSubtree[i]);
								}
								vec<int> this_later;
								for (unsigned int i = 0; i < thisSubtree.size(); i++) {
									this_later.push(thisSubtree[i]);
								}
								for (unsigned int i = 0; i < later.size(); i++) {
									this_later.push(later[i]);
								}

								const int size1 = earlier.size() * prev_this_later.size();
								const int size2 = prev.size() * this_later.size();
								const int size3 = thisSubtree.size() * prev_later.size();
								r = Reason_new(size1 + size2 + size3 + 2);
								(*r)[1] = evidenceThis;
								(*r)[2] = evidenceOther;

								// 1. Earlier can't reach prev, this or later
								explainAcantreachB(r, 3, earlier, prev_this_later);

								// 2. Prev can't reach this or later
								explainAcantreachB(r, 3 + size1, prev, this_later);

								// 3. this can't reach prev or unexplored (except for the one we're setting)
								explainAcantreachB(r, 3 + size1 + size2, thisSubtree, prev_later, backfrom, backto);
							}
						}

						addPropagation(true, backfrom, backto, r);
					}
				}

				// When a new subtree has been explored, update the prev and earlier vectors (only necessary
				// if explaining)
				for (unsigned int i = 0; i < prev.size(); i++) {
					earlier.push(prev[i]);
				}
				prev.clear();
				for (unsigned int i = 0; i < thisSubtree.size(); i++) {
					prev.push(thisSubtree[i]);
				}

				// Set the new subtree boundaries
				startSubtree = endSubtree + 1;
				endSubtree = nodesSeen - 1;
			}
		}

		// If we haven't reached all of the nodes and something we have reached has to
		// be included, then set everything outside to take its own index
		if (nodesSeen != size) {
			vec<int> seen;
			vec<int> notseen;

			for (int var = 0; var < size; var++) {
				if (index[var] >= 0) {
					seen.push(var);
				} else {
					notseen.push(var);
				}
			}
			const int numNotSeen = size - nodesSeen;
			assert(static_cast<int>(seen.size()) == nodesSeen);
			assert(static_cast<int>(notseen.size()) == numNotSeen);

			const Lit evidenceSeen = getEvidenceLit(seen);
			if (evidenceSeen != lit_True) {
				// XXX [AS] Commented following line, because propagator related statistics
				// should be collected within the propagator class.
				// engine.disconnected++;
				Clause* r = nullptr;

				if (so.lazy) {
					// need to say that each seen node doesn't reach any non-seen node
					r = Reason_new(nodesSeen * numNotSeen + 2);
					(*r)[1] = evidenceSeen;
					explainAcantreachB(r, 2, seen, notseen);
				}
				for (unsigned int i = 0; i < notseen.size(); i++) {
					const int outsideVar = notseen[i];
					if (x[outsideVar].setValNotR(outsideVar)) {
						if (!x[outsideVar].setVal(outsideVar, r)) {
							return false;
						}
					}
				}
			}
		}

		// If we're pruning root edges and there was more than one subtree, prune edges from the root to
		// earlier subtrees
		if (pruneRoot && startSubtree > 1) {
			// Check there's evidence
			// First find the nodes in the last subtree (and disconnected nodes) and those in the earlier
			// ones

			vec<int> lastSubtreeAndOutside;
			vec<int> earlierSubtree;
			for (int i = 0; i < size; i++) {
				if (index[i] >= startSubtree || index[i] < 0) {
					lastSubtreeAndOutside.push(i);
				} else if (index[i] > 0) {  // The root is considered in no subtree
					earlierSubtree.push(i);
				} else {
					assert(i == root);
				}
			}
			assert(earlierSubtree.size() > 0);
			assert(earlierSubtree.size() + lastSubtreeAndOutside.size() + 1 ==
						 static_cast<unsigned int>(size));
			const Lit evidenceLast = getEvidenceLit(lastSubtreeAndOutside);
			if (evidenceLast != lit_True) {
				// Build the reason if necessary (it will be the same for all of the pruned edges)
				Clause* r = nullptr;
				if (so.lazy) {
					// Reason should state that no var in an earlier sub tree reaches a var
					// in the last subtree or outside
					r = Reason_new(earlierSubtree.size() * lastSubtreeAndOutside.size() + 2);
					(*r)[1] = evidenceLast;
					explainAcantreachB(r, 2, earlierSubtree, lastSubtreeAndOutside);
				}

				// Prune all edges from the root to nodes in earlier subtrees
				for (int i = 0; i < size; i++) {
					if (i != root && index[i] < startSubtree) {
						addPropagation(false, root, i, r);
					}
				}

				/* for (typename IntView<U>::iterator i = x[root].begin(); i != x[root].end(); ++i)
				 {
						 if(*i != root && index[*i] < startSubtree)
						 {
								 // XXX [AS] Commented following line, because propagator related statistics
								 // should be collected within the propagator class.
								 //engine.prunedRoot++;
								 addPropagation(false, root, *i, r);
						 }
				 }*/
			}
		}

		// Perform the propagations
		for (unsigned int i = 0; i < propQueue.size(); i++) {
			PROP const p = propQueue[i];
			// fprintf(stderr, "propagating\n");
			if (p.fix) {
				if (x[p.var].setValNotR(p.val)) {
					if (!x[p.var].setVal(p.val, p.reason)) {
						return false;
					}
				}
			} else {
				if (x[p.var].remValNotR(p.val)) {
					if (!x[p.var].remVal(p.val, p.reason)) {
						return false;
					}
				}
			}
		}
		return true;
	}